

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-example1.c
# Opt level: O0

wchar_t main(void)

{
  wchar_t *__s;
  char *plaintext_out;
  ptrdiff_t pVar1;
  ptrdiff_t res;
  char *decoded;
  wchar_t *encoded;
  wchar_t *rcnb_contrast;
  char *input;
  char *code_out;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int *code_in;
  
  code_in = anon_var_dwarf_41;
  __s = (wchar_t *)malloc(0x400);
  plaintext_out = (char *)malloc(0x100);
  setlocale(6,"");
  code_out = "The Quick Brown RC Jumps Over the NB Dog.";
  strlen("The Quick Brown RC Jumps Over the NB Dog.");
  rcnb_encode(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(wchar_t *)code_out);
  wprintf(anon_var_dwarf_71,__s);
  wcslen(__s);
  pVar1 = rcnb_decode(code_in,(size_t)__s,plaintext_out);
  if (pVar1 < 0) {
    wprintf(anon_var_dwarf_87);
  }
  printf("decoded: %s\n",plaintext_out);
  free(__s);
  free(plaintext_out);
  return L'\0';
}

Assistant:

int main()
{
    const char* input = "The Quick Brown RC Jumps Over the NB Dog.";
    const wchar_t* rcnb_contrast = L"ȐčnÞȒċƝÞȐĈnƁȒȼǹþȓĆǹƃřČŇbȓƇńƄȓċȵƀȐĉņþŕƇNƅɌĉŇBȓƈȠßŕƇŃBɌċnþȓȼǸƅɌćÑbȒċƝÞƦȻƝƃŕƇNbȓƇNþŕC";
    wchar_t* encoded = malloc(SIZE * sizeof(wchar_t));
    char* decoded = malloc(SIZE);

    setlocale(LC_ALL, "");

    /* encode the data */
    rcnb_encode(input, strlen(input), encoded);
    wprintf(L"encoded: %ls\n", encoded);

    /* decode the data */
    ptrdiff_t res = rcnb_decode(encoded, wcslen(encoded), decoded);
    if (res < 0)
        wprintf(L"decode failed\n");
    printf("decoded: %s\n", decoded);

    /* compare the original and decoded data */
    assert(strcmp(input, decoded) == 0);
    assert(wcscmp(encoded, rcnb_contrast) == 0);

    free(encoded);
    free(decoded);
    return 0;
}